

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O1

void __thiscall
baryonyx::details::ap_file_observer::ap_file_observer
          (ap_file_observer *this,string_view filename,int m,int n,long param_4)

{
  allocator_type local_19;
  
  this->constraints = m;
  this->variables = n;
  this->m_frame = 0;
  (this->m_basename)._M_dataplus._M_p = (pointer)&(this->m_basename).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->m_basename,filename._M_str,filename._M_str + filename._M_len);
  std::vector<float,_std::allocator<float>_>::vector(&this->m_value,(long)this->variables,&local_19)
  ;
  return;
}

Assistant:

ap_file_observer(const std::string_view filename,
                     int m,
                     int n,
                     long int /*loop*/)
      : constraints(m)
      , variables(n)
      , m_frame(0)
      , m_basename(std::move(filename))
      , m_value(variables)
    {}